

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O3

int FString::FormatHelper(void *data,char *cstr,int len)

{
  ulong uVar1;
  uint uVar2;
  void *__dest;
  size_t __n;
  long lVar3;
  
  lVar3 = *data;
  uVar2 = *(uint *)(lVar3 + -0xc);
  __n = (size_t)len;
  uVar1 = __n + uVar2;
  if (lVar3 == 0x723dac || *(uint *)(lVar3 + -8) < uVar1) {
    ReallocBuffer((FString *)data,uVar1 + 0x7f & 0xffffffffffffff80);
    lVar3 = *data;
  }
  __dest = (void *)(lVar3 + (ulong)uVar2);
  memcpy(__dest,cstr,__n);
  *(undefined1 *)(__n + (long)__dest) = 0;
  *(int *)(*data + -0xc) = (int)uVar1;
  return len;
}

Assistant:

int FString::FormatHelper (void *data, const char *cstr, int len)
{
	FString *str = (FString *)data;
	size_t len1 = str->Len();
	if (len1 + len > str->Data()->AllocLen || str->Chars == &NullString.Nothing[0])
	{
		str->ReallocBuffer((len1 + len + 127) & ~127);
	}
	StrCopy (str->Chars + len1, cstr, len);
	str->Data()->Len = (unsigned int)(len1 + len);
	return len;
}